

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  size_t *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  wchar_t r;
  lha *lha;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  archive_read *a_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar1;
  
  a_00 = *(archive_read **)in_RDI[0x15].archive_format_name;
  if (*(long *)&(a_00->archive).archive_format != 0) {
    __archive_read_consume(a_00,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *(undefined8 *)&(a_00->archive).archive_format = 0;
  }
  if (*(char *)((long)&a_00->bidders[0].init + 4) == '\0') {
    if (*(char *)((long)&a_00->bidders[0].init + 6) == '\0') {
      wVar1 = lha_read_data_none(in_RSI,in_RDX,in_RCX,(int64_t *)a_00);
    }
    else {
      wVar1 = lha_read_data_lzh((archive_read *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (void **)in_RDI,(size_t *)in_RSI,(int64_t *)in_RDX);
    }
  }
  else {
    if (*(char *)((long)&a_00->bidders[0].init + 5) == '\0') {
      if ((((ulong)(a_00->archive).error_string.s & 8) != 0) &&
         (*(short *)((long)&(a_00->client).opener + 2) !=
          *(short *)&(a_00->archive).archive_format_name)) {
        archive_set_error(in_RDI,-1,"LHa data CRC error");
        return L'\xffffffec';
      }
      *(undefined1 *)((long)&a_00->bidders[0].init + 5) = 1;
    }
    *in_RCX = *(size_t *)&a_00->archive;
    *in_RDX = (void *)0x0;
    (in_RSI->archive).magic = 0;
    (in_RSI->archive).state = 0;
    wVar1 = L'\x01';
  }
  return wVar1;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		if (!lha->end_of_entry_cleanup) {
			if ((lha->setflag & CRC_IS_SET) &&
			    lha->crc != lha->entry_crc_calculated) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "LHa data CRC error");
				return (ARCHIVE_WARN);
			}

			/* End-of-entry cleanup done. */
			lha->end_of_entry_cleanup = 1;
		}
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}